

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast_operators.cpp
# Opt level: O2

bool duckdb::TryCastDecimalToNumeric<int,int>
               (int input,int *result,CastParameters *parameters,uint8_t scale)

{
  undefined7 in_register_00000009;
  
  *result = (int)(((long)((-(ulong)((uint)input >> 0x1f) ^
                          *(ulong *)(NumericHelper::POWERS_OF_TEN +
                                    (CONCAT71(in_register_00000009,scale) & 0xffffffff) * 8)) +
                         (ulong)((uint)input >> 0x1f)) / 2 + (long)input) /
                 (long)*(ulong *)(NumericHelper::POWERS_OF_TEN +
                                 (CONCAT71(in_register_00000009,scale) & 0xffffffff) * 8));
  return true;
}

Assistant:

bool TryCastDecimalToNumeric(SRC input, DST &result, CastParameters &parameters, uint8_t scale) {
	// Round away from 0.
	const auto power = NumericHelper::POWERS_OF_TEN[scale];
	// https://graphics.stanford.edu/~seander/bithacks.html#ConditionalNegate
	const auto fNegate = int64_t(input < 0);
	const auto rounding = ((power ^ -fNegate) + fNegate) / 2;
	const auto scaled_value = (input + rounding) / power;
	if (!TryCast::Operation<SRC, DST>(UnsafeNumericCast<SRC>(scaled_value), result)) {
		string error = StringUtil::Format("Failed to cast decimal value %d to type %s", scaled_value, GetTypeId<DST>());
		HandleCastError::AssignError(error, parameters);
		return false;
	}
	return true;
}